

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSelector.cpp
# Opt level: O1

int __thiscall
Kernel::LiteralSelector::select
          (LiteralSelector *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds
          ,timeval *__timeout)

{
  Literal *pLVar1;
  uint i;
  int extraout_EAX;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined4 in_register_00000034;
  Clause *this_00;
  bool bVar6;
  Literal *__tmp;
  int iVar7;
  
  this_00 = (Clause *)CONCAT44(in_register_00000034,__nfds);
  if ((int)__readfds == 0) {
    __readfds = (fd_set *)(ulong)(*(uint *)&this_00->field_0x38 & 0xfffff);
  }
  if ((uint)__readfds < 2) {
    uVar2 = *(ulong *)&this_00->field_0x38 & 0xfff00000ffffffff | (long)__readfds << 0x20;
  }
  else {
    iVar5 = (uint)((*(ushort *)
                     (*(long *)(*(long *)(DAT_00b7e1b0 + 0x80) +
                               (ulong)(this_00->_literals[0]->super_Term)._functor * 8) + 0x40) &
                   0x420) == 0) * 2 + -2;
    uVar3 = 1;
    bVar6 = false;
    uVar4 = 1;
    do {
      pLVar1 = this_00->_literals[(int)uVar3];
      iVar7 = (uint)((*(ushort *)
                       (*(long *)(*(long *)(DAT_00b7e1b0 + 0x80) +
                                 (ulong)(pLVar1->super_Term)._functor * 8) + 0x40) & 0x420) == 0) *
              2 + -2;
      if (iVar7 == iVar5) {
        if (uVar3 != uVar4) {
          this_00->_literals[(int)uVar3] = this_00->_literals[(int)uVar4];
          this_00->_literals[(int)uVar4] = pLVar1;
          bVar6 = true;
        }
        uVar4 = uVar4 + 1;
      }
      else if (iVar5 < iVar7) {
        this_00->_literals[(int)uVar3] = this_00->_literals[0];
        this_00->_literals[0] = pLVar1;
        bVar6 = true;
        uVar4 = 1;
        iVar5 = iVar7;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)__readfds != uVar3);
    if (bVar6) {
      Clause::notifyLiteralReorder(this_00);
    }
    if (uVar4 != 1) {
      iVar5 = (*this->_vptr_LiteralSelector[4])(this,this_00,(ulong)uVar4);
      return iVar5;
    }
    uVar2 = *(ulong *)&this_00->field_0x38 & 0xfff00000ffffffff | 0x100000000;
  }
  *(ulong *)&this_00->field_0x38 = uVar2;
  Clause::notifyLiteralReorder(this_00);
  return extraout_EAX;
}

Assistant:

void LiteralSelector::select(Clause* c, unsigned eligibleInp)
{
  ASS_LE(eligibleInp, c->length());

  if(eligibleInp==0) {
    eligibleInp = c->length();
  }

  if(eligibleInp<=1) {
    c->setSelected(eligibleInp);
    return;
  }

  unsigned eligible=1;
  { /* we order the clause so that the literals with highest `getSelectionPriority` are in the front, and eligible is the number of literals with that selection priority */ 
    int maxPriority=getSelectionPriority((*c)[0]);
    bool modified=false;

    for (unsigned i = 1; i < eligibleInp; i++) {
      int priority = getSelectionPriority((*c)[i]);
      if (priority == maxPriority) {
        if (eligible != i) {
          swap((*c)[i], (*c)[eligible]);
          modified = true;
        }
        eligible++;
      } else if (priority > maxPriority) {
        maxPriority = priority;
        eligible = 1;
        swap((*c)[i], (*c)[0]);
        modified = true;
      }
    }
    ASS_LE(eligible,eligibleInp);
    if(modified) {
      c->notifyLiteralReorder();
    }
  }

  if(eligible==1) {
    c->setSelected(eligible);
    return;
  }

  ASS_G(eligible,1);
  doSelection(c, eligible);
}